

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  long lVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  stbi_uc *psVar9;
  char *pcVar10;
  long lVar11;
  byte *pbVar12;
  stbi__uint32 sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  stbi_uc *psVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar23;
  byte bVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  byte *pbVar29;
  ulong uVar30;
  long in_FS_OFFSET;
  bool bVar31;
  stbi_uc *local_f0;
  byte *local_e0;
  stbi_uc *local_d0;
  ulong local_78;
  ulong uVar22;
  
  bVar31 = depth == 0x10;
  uVar19 = x * out_n;
  uVar5 = uVar19 << bVar31;
  a_00 = a->s->img_n;
  uVar6 = a_00 << bVar31;
  if (a_00 + 1 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                  ,0x1237,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar9 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar31,0);
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    pcVar10 = "outofmem";
  }
  else {
    iVar7 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar7 == 0) {
      pcVar10 = "too large";
    }
    else {
      uVar8 = a_00 * x;
      uVar21 = uVar8 * depth + 7 >> 3;
      uVar22 = (ulong)uVar21;
      if ((uVar21 + 1) * y <= raw_len) {
        lVar11 = (long)a_00;
        lVar25 = (long)(out_n << bVar31);
        lVar26 = -lVar25;
        lVar17 = -(ulong)uVar5;
        uVar23 = 0;
        uVar27 = 0;
        local_78 = (ulong)x;
        do {
          if (uVar27 == y) {
            if (7 < depth) {
              if (depth != 0x10) {
                return 1;
              }
              psVar9 = a->out;
              for (lVar11 = 0; uVar19 * y != (int)lVar11; lVar11 = lVar11 + 1) {
                puVar1 = (ushort *)(psVar9 + lVar11 * 2);
                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              }
              return 1;
            }
            uVar6 = 0;
            uVar27 = 0;
            do {
              if (uVar27 == y) {
                return 1;
              }
              bVar4 = 1;
              if (color == 0) {
                bVar4 = ""[depth];
              }
              uVar20 = (ulong)uVar6;
              psVar9 = a->out;
              uVar16 = (ulong)(uVar5 * (int)uVar27);
              if (depth == 4) {
                lVar11 = (uVar19 - uVar22) + uVar20;
                lVar17 = 0;
                for (uVar21 = uVar8; 1 < (int)uVar21; uVar21 = uVar21 - 2) {
                  psVar9[lVar17 * 2 + uVar20] = (psVar9[lVar17 + lVar11] >> 4) * bVar4;
                  psVar9[lVar17 * 2 + uVar20 + 1] = (psVar9[lVar17 + lVar11] & 0xf) * bVar4;
                  lVar17 = lVar17 + 1;
                }
                if (uVar21 == 1) {
                  psVar9[lVar17 * 2 + uVar20] = (psVar9[lVar17 + lVar11] >> 4) * bVar4;
                }
              }
              else {
                pbVar29 = psVar9 + ((uVar19 + uVar16) - uVar22);
                if (depth == 2) {
                  psVar9 = psVar9 + uVar20 + 3;
                  for (uVar21 = uVar8; 3 < (int)uVar21; uVar21 = uVar21 - 4) {
                    psVar9[-3] = (*pbVar29 >> 6) * bVar4;
                    psVar9[-2] = (*pbVar29 >> 4 & 3) * bVar4;
                    psVar9[-1] = (*pbVar29 >> 2 & 3) * bVar4;
                    *psVar9 = (*pbVar29 & 3) * bVar4;
                    pbVar29 = pbVar29 + 1;
                    psVar9 = psVar9 + 4;
                  }
                  if (((0 < (int)uVar21) && (psVar9[-3] = (*pbVar29 >> 6) * bVar4, uVar21 != 1)) &&
                     (psVar9[-2] = (*pbVar29 >> 4 & 3) * bVar4, uVar21 == 3)) {
                    psVar9[-1] = (*pbVar29 >> 2 & 3) * bVar4;
                  }
                }
                else if (depth == 1) {
                  pbVar12 = psVar9 + uVar20 + 7;
                  for (uVar21 = uVar8; 7 < (int)uVar21; uVar21 = uVar21 - 8) {
                    pbVar12[-7] = (char)*pbVar29 >> 7 & bVar4;
                    pbVar12[-6] = (char)(*pbVar29 * '\x02') >> 7 & bVar4;
                    pbVar12[-5] = (char)(*pbVar29 << 2) >> 7 & bVar4;
                    pbVar12[-4] = (char)(*pbVar29 << 3) >> 7 & bVar4;
                    pbVar12[-3] = (char)(*pbVar29 << 4) >> 7 & bVar4;
                    pbVar12[-2] = (char)(*pbVar29 << 5) >> 7 & bVar4;
                    pbVar12[-1] = (char)(*pbVar29 << 6) >> 7 & bVar4;
                    bVar24 = bVar4;
                    if ((*pbVar29 & 1) == 0) {
                      bVar24 = 0;
                    }
                    *pbVar12 = bVar24;
                    pbVar29 = pbVar29 + 1;
                    pbVar12 = pbVar12 + 8;
                  }
                  if (((((0 < (int)uVar21) &&
                        (pbVar12[-7] = (char)*pbVar29 >> 7 & bVar4, uVar21 != 1)) &&
                       ((pbVar12[-6] = (char)(*pbVar29 * '\x02') >> 7 & bVar4, 2 < uVar21 &&
                        ((pbVar12[-5] = (char)(*pbVar29 << 2) >> 7 & bVar4, uVar21 != 3 &&
                         (pbVar12[-4] = (char)(*pbVar29 << 3) >> 7 & bVar4, 4 < uVar21)))))) &&
                      (pbVar12[-3] = (char)(*pbVar29 << 4) >> 7 & bVar4, uVar21 != 5)) &&
                     (pbVar12[-2] = (char)(*pbVar29 << 5) >> 7 & bVar4, uVar21 == 7)) {
                    pbVar12[-1] = (char)(*pbVar29 << 6) >> 7 & bVar4;
                  }
                }
              }
              if (a_00 != out_n) {
                psVar9 = a->out;
                if (a_00 == 1) {
                  uVar21 = x * 2 - 1;
                  for (iVar7 = 0; -1 < (int)((x - 1) + iVar7); iVar7 = iVar7 + -1) {
                    psVar9[uVar21 + uVar16] = 0xff;
                    psVar9[(uVar21 - 1) + uVar16] = psVar9[((x - 1) + iVar7 & 0x7fffffff) + uVar16];
                    uVar21 = uVar21 - 2;
                  }
                }
                else {
                  iVar7 = x - 1;
                  uVar23 = x * 4;
                  uVar21 = x * 3;
                  if (a_00 != 3) {
                    __assert_fail("img_n == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                                  ,0x12e4,
                                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                 );
                  }
                  while( true ) {
                    uVar21 = uVar21 - 3;
                    if (iVar7 < 0) break;
                    psVar9[(uVar23 - 1) + uVar16] = 0xff;
                    psVar9[(uVar23 - 2) + uVar16] = psVar9[(ulong)uVar21 + uVar16 + 2];
                    psVar9[(uVar23 - 3) + uVar16] = psVar9[(ulong)uVar21 + uVar16 + 1];
                    psVar9[(uVar23 - 4) + uVar16] = psVar9[uVar21 + uVar16];
                    iVar7 = iVar7 + -1;
                    uVar23 = uVar23 - 4;
                  }
                }
              }
              uVar27 = uVar27 + 1;
              uVar6 = uVar6 + uVar5;
            } while( true );
          }
          uVar16 = (ulong)*raw;
          if (4 < uVar16) {
            pcVar10 = "invalid filter";
            goto LAB_001267c9;
          }
          local_f0 = a->out + uVar5 * (int)uVar27;
          if (depth < 8) {
            if (x < uVar21) {
              pcVar10 = "invalid width";
              goto LAB_001267c9;
            }
            local_f0 = local_f0 + (uVar19 - uVar21);
            uVar6 = 1;
            local_78 = uVar22;
          }
          if (uVar27 == 0) {
            uVar16 = (ulong)""[uVar16];
          }
          uVar20 = 0;
          if (0 < (int)uVar6) {
            uVar20 = (ulong)uVar6;
          }
          for (uVar30 = 0; uVar20 != uVar30; uVar30 = uVar30 + 1) {
            switch(uVar16) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar4 = raw[uVar30 + 1];
              break;
            case 2:
              bVar4 = local_f0[uVar30 + lVar17];
              goto LAB_00125eb4;
            case 3:
              bVar4 = local_f0[uVar30 + lVar17] >> 1;
LAB_00125eb4:
              bVar4 = bVar4 + raw[uVar30 + 1];
              break;
            case 4:
              bVar4 = raw[uVar30 + 1];
              iVar7 = stbi__paeth(0,(uint)local_f0[uVar30 + lVar17],0);
              bVar4 = (char)iVar7 + bVar4;
              break;
            default:
              goto switchD_00125e68_default;
            }
            local_f0[uVar30] = bVar4;
switchD_00125e68_default:
          }
          lVar14 = (long)(int)uVar6;
          if (depth == 8) {
            lVar15 = (long)out_n;
            lVar2 = lVar11;
            if (a_00 != out_n) {
              local_f0[lVar11] = 0xff;
            }
LAB_00125f37:
            local_e0 = raw + lVar2 + 1;
          }
          else {
            if (depth == 0x10) {
              lVar15 = lVar25;
              lVar2 = lVar14;
              if (a_00 != out_n) {
                local_f0[lVar14] = 0xff;
                local_f0[lVar14 + 1] = 0xff;
              }
              goto LAB_00125f37;
            }
            local_e0 = raw + 2;
            lVar15 = 1;
          }
          psVar9 = local_f0 + lVar15;
          local_d0 = local_f0 + lVar15 + lVar17;
          if (depth < 8 || a_00 == out_n) {
            uVar28 = ((int)local_78 + -1) * uVar6;
            switch(uVar16) {
            case 0:
              memcpy(psVar9,local_e0,(long)(int)uVar28);
              break;
            case 1:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar16 = 0; uVar3 != uVar16; uVar16 = uVar16 + 1) {
                psVar9[uVar16] = psVar9[uVar16 - lVar14] + local_e0[uVar16];
              }
              break;
            case 2:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar16 = 0; uVar3 != uVar16; uVar16 = uVar16 + 1) {
                psVar9[uVar16] = psVar9[uVar16 + lVar17] + local_e0[uVar16];
              }
              break;
            case 3:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              uVar16 = (ulong)uVar3;
              pbVar29 = local_e0;
              while (bVar31 = uVar16 != 0, uVar16 = uVar16 - 1, bVar31) {
                *psVar9 = (char)((uint)psVar9[-lVar14] + (uint)psVar9[lVar17] >> 1) + *pbVar29;
                psVar9 = psVar9 + 1;
                pbVar29 = pbVar29 + 1;
              }
              break;
            case 4:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar16 = 0; uVar16 != uVar3; uVar16 = uVar16 + 1) {
                bVar4 = local_e0[uVar16];
                iVar7 = stbi__paeth((uint)psVar9[uVar16 - lVar14],(uint)local_d0[uVar16],
                                    (uint)local_d0[uVar16 - lVar14]);
                psVar9[uVar16] = (char)iVar7 + bVar4;
              }
              break;
            case 5:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar16 = 0; uVar3 != uVar16; uVar16 = uVar16 + 1) {
                psVar9[uVar16] = (psVar9[uVar16 - lVar14] >> 1) + local_e0[uVar16];
              }
              break;
            case 6:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar16 = 0; uVar3 != uVar16; uVar16 = uVar16 + 1) {
                psVar9[uVar16] = psVar9[uVar16 - lVar14] + local_e0[uVar16];
              }
            }
            local_e0 = local_e0 + (int)uVar28;
          }
          else {
            if (a_00 + 1 != out_n) {
              __assert_fail("img_n+1 == out_n",
                            "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                            ,0x128b,
                            "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                           );
            }
            switch(uVar16) {
            case 0:
              sVar13 = x;
              while (sVar13 = sVar13 - 1, sVar13 != 0) {
                for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                  psVar9[uVar16] = local_e0[uVar16];
                }
                psVar9[lVar14] = 0xff;
                local_e0 = local_e0 + lVar14;
                psVar9 = psVar9 + lVar25;
              }
              break;
            case 1:
              sVar13 = x;
              while (sVar13 = sVar13 - 1, sVar13 != 0) {
                for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                  psVar9[uVar16] = psVar9[uVar16 + lVar26] + local_e0[uVar16];
                }
                psVar9[lVar14] = 0xff;
                local_e0 = local_e0 + lVar14;
                psVar9 = psVar9 + lVar25;
              }
              break;
            case 2:
              sVar13 = x;
              while (sVar13 = sVar13 - 1, sVar13 != 0) {
                for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                  psVar9[uVar16] = psVar9[uVar16 + lVar17] + local_e0[uVar16];
                }
                psVar9[lVar14] = 0xff;
                local_e0 = local_e0 + lVar14;
                psVar9 = psVar9 + lVar25;
              }
              break;
            case 3:
              sVar13 = x;
              while (sVar13 = sVar13 - 1, pbVar29 = local_e0, psVar18 = psVar9, uVar16 = uVar20,
                    sVar13 != 0) {
                while (uVar16 != 0) {
                  *psVar18 = (char)((uint)psVar18[lVar26] + (uint)psVar18[lVar17] >> 1) + *pbVar29;
                  pbVar29 = pbVar29 + 1;
                  psVar18 = psVar18 + 1;
                  uVar16 = uVar16 - 1;
                }
                psVar9[lVar14] = 0xff;
                local_e0 = local_e0 + lVar14;
                psVar9 = psVar9 + lVar25;
              }
              break;
            case 4:
              psVar18 = local_f0 + lVar15 + lVar26;
              local_f0 = local_f0 + lVar15 + (lVar26 - (ulong)uVar5);
              sVar13 = x;
              while (sVar13 = sVar13 - 1, sVar13 != 0) {
                for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                  bVar4 = local_e0[uVar16];
                  iVar7 = stbi__paeth((uint)psVar18[uVar16],(uint)local_d0[uVar16],
                                      (uint)local_f0[uVar16]);
                  psVar9[uVar16] = (char)iVar7 + bVar4;
                }
                psVar9[lVar14] = 0xff;
                local_e0 = local_e0 + lVar14;
                psVar9 = psVar9 + lVar25;
                local_d0 = local_d0 + lVar25;
                psVar18 = psVar18 + lVar25;
                local_f0 = local_f0 + lVar25;
              }
              break;
            case 5:
              sVar13 = x;
              while (sVar13 = sVar13 - 1, sVar13 != 0) {
                for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                  psVar9[uVar16] = (psVar9[uVar16 + lVar26] >> 1) + local_e0[uVar16];
                }
                psVar9[lVar14] = 0xff;
                local_e0 = local_e0 + lVar14;
                psVar9 = psVar9 + lVar25;
              }
              break;
            case 6:
              sVar13 = x;
              while (sVar13 = sVar13 - 1, sVar13 != 0) {
                for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                  psVar9[uVar16] = psVar9[uVar16 + lVar26] + local_e0[uVar16];
                }
                psVar9[lVar14] = 0xff;
                local_e0 = local_e0 + lVar14;
                psVar9 = psVar9 + lVar25;
              }
            }
            if (depth == 0x10) {
              psVar9 = a->out + (long)(int)(uVar6 + 1) + (ulong)uVar23;
              sVar13 = x;
              while (bVar31 = sVar13 != 0, sVar13 = sVar13 - 1, bVar31) {
                *psVar9 = 0xff;
                psVar9 = psVar9 + lVar25;
              }
            }
          }
          uVar27 = uVar27 + 1;
          uVar23 = uVar23 + uVar5;
          raw = local_e0;
        } while( true );
      }
      pcVar10 = "not enough pixels";
    }
  }
LAB_001267c9:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar10;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }